

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_facade.cpp
# Opt level: O1

void __thiscall Clasp::ClaspFacade::SolveStrategy::Async::doNotify(Async *this,Event event)

{
  __int_type _Var1;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_30;
  
  local_30._M_device = &this->mqMutex_;
  local_30._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_30);
  local_30._M_owns = true;
  switch(event) {
  case event_model:
    _Var1 = 10;
    break;
  case event_resume:
    if ((this->super_SolveStrategy).state_.super___atomic_base<unsigned_int>._M_i != 2)
    goto LAB_0011d05b;
  case event_attach:
    _Var1 = 1;
    break;
  case event_detach:
    _Var1 = 4;
    break;
  default:
    goto switchD_0011cfec_default;
  }
  LOCK();
  (this->super_SolveStrategy).state_.super___atomic_base<unsigned_int>._M_i = _Var1;
  UNLOCK();
switchD_0011cfec_default:
  std::unique_lock<std::mutex>::unlock(&local_30);
  std::condition_variable::notify_all();
  if (event == event_model) {
    std::unique_lock<std::mutex>::lock(&local_30);
    _Var1 = (this->super_SolveStrategy).state_.super___atomic_base<unsigned_int>._M_i;
    while ((_Var1 != 1 &&
           ((this->super_SolveStrategy).signal_.super___atomic_base<unsigned_int>._M_i == 0))) {
      std::condition_variable::wait((unique_lock *)&this->mqCond_);
      _Var1 = (this->super_SolveStrategy).state_.super___atomic_base<unsigned_int>._M_i;
    }
  }
LAB_0011d05b:
  std::unique_lock<std::mutex>::~unique_lock(&local_30);
  return;
}

Assistant:

virtual void doNotify(Event event) {
		mt::unique_lock<Clasp::mt::mutex> lock(mqMutex_);
		switch (event) {
			case event_attach: state_ = state_run;  break;
			case event_model : state_ = state_next; break;
			case event_resume: if (state_ == state_model) { state_ = state_run; break; } else { return; }
			case event_detach: state_ = state_done;  break;
		};
		lock.unlock(); // synchronize-with other threads but no need to notify under lock
		mqCond_.notify_all();
		if (event == event_model) {
			for (lock.lock(); state_ != state_run && !signal();) {
				mqCond_.wait(lock);
			}
		}
	}